

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

expression_ptr __thiscall mjs::parser::parse_primary_expression(parser *this)

{
  token_type tVar1;
  expression *peVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  int iVar5;
  bool bVar6;
  ulong uVar7;
  size_type sVar8;
  __normal_iterator<mjs::property_name_and_value_*,_std::vector<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>_>
  _Var9;
  wostream *pwVar10;
  char *in_RCX;
  wchar_t *pwVar11;
  wstring_view *s;
  property_name_and_value *this_00;
  int iVar12;
  parser *in_RSI;
  token *this_01;
  wchar_t *in_R9;
  property_name_and_value *ppVar13;
  bool bVar14;
  wstring_view message;
  property_name_and_value_list elements;
  wstring new_item_str;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_278;
  token id;
  wstring_view lit;
  size_type local_b8;
  pointer local_b0;
  token local_a8;
  token local_80;
  token local_58;
  
  iVar12 = (int)in_RSI;
  accept((parser *)&id,iVar12,(sockaddr *)0x2,(socklen_t *)in_RCX);
  if (id.type_ == eof) {
    accept((parser *)&lit,iVar12,(sockaddr *)0x65,(socklen_t *)in_RCX);
    iVar5 = (int)lit._M_len;
    token::destroy((token *)&lit);
    if (iVar5 == 0x72) {
      if (0 < (int)in_RSI->version_) {
        accept((parser *)&lit,iVar12,(sockaddr *)0x32,(socklen_t *)in_RCX);
        iVar5 = (int)lit._M_len;
        token::destroy((token *)&lit);
        if (iVar5 != 0x72) {
          new_item_str.field_2._M_allocated_capacity = 0;
          new_item_str._0_16_ = ZEXT816(0);
          bVar6 = false;
LAB_00177c5e:
          accept((parser *)&lit,iVar12,(sockaddr *)0x33,(socklen_t *)in_RCX);
          iVar5 = (int)lit._M_len;
          token::destroy((token *)&lit);
          if (iVar5 == 0x72) {
            accept((parser *)&lit,iVar12,(sockaddr *)0x20,(socklen_t *)in_RCX);
            iVar5 = (int)lit._M_len;
            token::destroy((token *)&lit);
            bVar14 = iVar5 == 0x72;
            if (!bVar14) goto LAB_00177cf3;
            if (bVar6) {
              in_RCX = "parse_primary_expression";
              expect(&local_58,in_RSI,comma,"parse_primary_expression",0x1da);
              token::destroy(&local_58);
            }
            parse_assignment_expression((parser *)&lit);
            std::
            vector<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::allocator<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>>
            ::emplace_back<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
                      ((vector<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::allocator<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>>
                        *)&new_item_str,
                       (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)&lit);
            goto LAB_00177d16;
          }
          make_expression<mjs::array_literal_expression,std::vector<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::allocator<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>>>
                    (this,(vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
                           *)in_RSI);
          std::
          vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
          ::~vector((vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
                     *)&new_item_str);
          goto LAB_00177d8f;
        }
        if (0 < (int)in_RSI->version_) {
          accept((parser *)&lit,iVar12,(sockaddr *)0x30,(socklen_t *)in_RCX);
          iVar5 = (int)lit._M_len;
          token::destroy((token *)&lit);
          if (iVar5 != 0x72) {
            elements.
            super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            elements.
            super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            elements.
            super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            while( true ) {
              accept((parser *)&lit,iVar12,(sockaddr *)0x31,(socklen_t *)in_RCX);
              iVar5 = (int)lit._M_len;
              token::destroy((token *)&lit);
              if (iVar5 != 0x72) break;
              if (elements.
                  super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  elements.
                  super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                in_RCX = "parse_primary_expression";
                expect(&local_80,in_RSI,comma,"parse_primary_expression",0x1e6);
                token::destroy(&local_80);
                if (1 < (int)in_RSI->version_) {
                  accept((parser *)&lit,iVar12,(sockaddr *)0x31,(socklen_t *)in_RCX);
                  iVar5 = (int)lit._M_len;
                  token::destroy((token *)&lit);
                  if (iVar5 != 0x72) break;
                }
              }
              parse_property_name_and_value((property_name_and_value *)&lit,in_RSI);
              std::
              vector<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>::
              emplace_back<mjs::property_name_and_value>(&elements,(property_name_and_value *)&lit);
              property_name_and_value::~property_name_and_value((property_name_and_value *)&lit);
              if (1 < (int)in_RSI->version_) {
                this_00 = elements.
                          super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
                          ._M_impl.super__Vector_impl_data._M_finish + -1;
                property_name_and_value::name_str_abi_cxx11_(&new_item_str,this_00);
                ppVar13 = elements.
                          super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
                          ._M_impl.super__Vector_impl_data._M_finish + -1;
                lit._M_str = (wchar_t *)this_00;
                lit._M_len = (size_t)&new_item_str;
                _Var9 = std::
                        __find_if<__gnu_cxx::__normal_iterator<mjs::property_name_and_value*,std::vector<mjs::property_name_and_value,std::allocator<mjs::property_name_and_value>>>,__gnu_cxx::__ops::_Iter_pred<mjs::parser::parse_primary_expression()::_lambda(mjs::property_name_and_value_const&)_1_>>
                                  (elements.
                                   super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
                                   ._M_impl.super__Vector_impl_data._M_start,ppVar13);
                if (_Var9._M_current != ppVar13) {
                  std::__cxx11::wostringstream::wostringstream((wostringstream *)&lit);
                  pwVar10 = std::operator<<((wostream *)&lit,"Invalid redefinition of property: \"")
                  ;
                  local_b8 = new_item_str._M_string_length;
                  local_b0 = new_item_str._M_dataplus._M_p;
                  cpp_quote_abi_cxx11_((wstring *)&local_278,(mjs *)&local_b8,s);
                  pwVar10 = std::operator<<(pwVar10,(wstring *)&local_278);
                  std::operator<<(pwVar10,"\"");
                  std::__cxx11::wstring::~wstring((wstring *)&local_278);
                  peVar2 = elements.
                           super__Vector_base<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
                           ._M_impl.super__Vector_impl_data._M_finish[-1].name_._M_t.
                           super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>
                           .super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl;
                  std::__cxx11::wstringbuf::str();
                  message._M_str = in_R9;
                  message._M_len = local_278._M_len;
                  syntax_error((parser *)"parse_primary_expression",(char *)0x207,(int)peVar2 + 8,
                               (source_extend *)local_278._M_str,message);
                }
                std::__cxx11::wstring::~wstring((wstring *)&new_item_str);
              }
            }
            make_expression<mjs::object_literal_expression,std::vector<mjs::property_name_and_value,std::allocator<mjs::property_name_and_value>>>
                      (this,(vector<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
                             *)in_RSI);
            std::vector<mjs::property_name_and_value,_std::allocator<mjs::property_name_and_value>_>
            ::~vector(&elements);
            goto LAB_00177d8f;
          }
          if ((0 < (int)in_RSI->version_) &&
             ((tVar1 = (in_RSI->current_token_).type_, tVar1 == divide || (tVar1 == divideequal))))
          {
            lit = lexer::get_regex_literal(&in_RSI->lexer_);
            pwVar11 = lit._M_str;
            uVar7 = lit._M_len;
            check_token(in_RSI);
            skip_whitespace(in_RSI);
            if (uVar7 < 3) {
              __assert_fail("lit.size() >= 3",
                            "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                            ,0x211,"expression_ptr mjs::parser::parse_primary_expression()");
            }
            if (*pwVar11 != L'/') {
              __assert_fail("lit[0] == \'/\'",
                            "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                            ,0x212,"expression_ptr mjs::parser::parse_primary_expression()");
            }
            sVar8 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::rfind
                              (&lit,L'/',0xffffffffffffffff);
            if (0xfffffffffffffffc < sVar8 - 2) {
              __assert_fail("lit_end > 1 && lit_end != std::wstring_view::npos",
                            "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                            ,0x214,"expression_ptr mjs::parser::parse_primary_expression()");
            }
            new_item_str._0_16_ =
                 std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::substr
                           (&lit,1,sVar8 - 1);
            local_278 = std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::substr
                                  (&lit,sVar8 + 1,0xffffffffffffffff);
            make_expression<mjs::regexp_literal_expression,std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,std::basic_string_view<wchar_t,std::char_traits<wchar_t>>>
                      (this,(basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)in_RSI,
                       (basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&new_item_str);
            goto LAB_00177d8f;
          }
        }
      }
      accept((parser *)&lit,iVar12,(sockaddr *)0x2e,(socklen_t *)in_RCX);
      iVar12 = (int)lit._M_len;
      token::destroy((token *)&lit);
      if (iVar12 == 0x72) {
        bVar6 = is_literal((in_RSI->current_token_).type_);
        if (!bVar6) {
          token::destroy(&id);
          unhandled(in_RSI,"parse_primary_expression",0x21e);
        }
        check_literal(in_RSI);
        get_token((token *)&lit,in_RSI);
        make_expression<mjs::literal_expression,mjs::token>(this,(token *)in_RSI);
        this_01 = (token *)&lit;
      }
      else {
        parse_expression(this);
        expect(&local_a8,in_RSI,rparen,"parse_primary_expression",0x218);
        this_01 = &local_a8;
      }
      token::destroy(this_01);
    }
    else {
      make_expression<mjs::this_expression>(this);
    }
  }
  else {
    token::text_abi_cxx11_(&id);
    make_expression<mjs::identifier_expression,std::__cxx11::wstring_const&>
              (this,(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                    in_RSI);
  }
LAB_00177d8f:
  token::destroy(&id);
  return (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)
         (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)this;
LAB_00177cf3:
  bVar4 = !bVar6;
  bVar6 = bVar14;
  if (bVar4) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = lit._M_str;
    lit = (wstring_view)(auVar3 << 0x40);
    std::
    vector<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::allocator<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>>
    ::emplace_back<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
              ((vector<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::allocator<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>>
                *)&new_item_str,
               (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)&lit);
LAB_00177d16:
    bVar6 = bVar14;
    if (lit._M_len != 0) {
      (**(code **)(*(long *)lit._M_len + 8))();
    }
  }
  goto LAB_00177c5e;
}

Assistant:

expression_ptr parse_primary_expression() {
        // PrimaryExpression :
        //  this
        //  Identifier
        //  Literal
        //  ArrayLiteral
        //  ObjectLiteral
        //  ( Expression )
        if (auto id = accept(token_type::identifier)) {
            return make_expression<identifier_expression>(id.text());
        } else if (accept(token_type::this_)) {
            return make_expression<this_expression>();
        } else if (version_ >= version::es3 && accept(token_type::lbracket)) {
            // ArrayLiteral
            std::vector<expression_ptr> elements;
            bool last_was_assignment_expression = false;
            while (!accept(token_type::rbracket)) {
                if (accept(token_type::comma)) {
                    if (!last_was_assignment_expression) {
                        elements.push_back(nullptr);
                    }
                    last_was_assignment_expression = false;
                } else {
                    if (last_was_assignment_expression) {
                        EXPECT(token_type::comma);
                    }
                    elements.push_back(parse_assignment_expression());
                    last_was_assignment_expression = true;
                }
            }
            return make_expression<array_literal_expression>(std::move(elements));
        } else if (version_ >= version::es3 && accept(token_type::lbrace)) {
            // ObjectLiteral
            property_name_and_value_list elements;
            while (!accept(token_type::rbrace)) {
                if (!elements.empty()) {
                    EXPECT(token_type::comma);
                    if (version_ >= version::es5 && accept(token_type::rbrace)) {
                        // Trailing comma allowed in ES5+
                        break;
                    }
                }
                elements.push_back(parse_property_name_and_value());
                if (version_ >= version::es5) {
                    const auto& new_item = elements.back();
                    const auto new_item_str = new_item.name_str();
                    auto e = elements.end() - 1;
                    auto it = std::find_if(elements.begin(), e, [&](const property_name_and_value& v) {
                        if (v.name_str() != new_item_str) {
                            // Item doesn't match
                            return false;
                        }
                        // Repeated definitions are not allowed for data properties in strict mode
                        if (new_item.type() == property_assignment_type::normal && v.type() == property_assignment_type::normal) {
                            return strict_mode_;
                        }
                        // May not change a data property to an accessor property or vice versa
                        if (new_item.type() == property_assignment_type::normal && v.type() != property_assignment_type::normal) {
                            return true;
                        }
                        if (new_item.type() != property_assignment_type::normal && v.type() == property_assignment_type::normal) {
                            return true;
                        }
                        // May only define getter/setter once
                        assert(new_item.type() == property_assignment_type::get || new_item.type() == property_assignment_type::set);
                        assert(v.type() == property_assignment_type::get || v.type() == property_assignment_type::set);
                        return new_item.type() == v.type();
                    });
                    if (it != e) {
                        SYNTAX_ERROR_AT("Invalid redefinition of property: \"" << cpp_quote(new_item_str) << "\"", elements.back().name().extend());
                    }
                }
            }
            return make_expression<object_literal_expression>(std::move(elements));
        } else if (version_ >= version::es3 && (current_token_type() == token_type::divide || current_token_type() == token_type::divideequal)) {
            // RegularExpressionLiteral
            const auto lit = lexer_.get_regex_literal();
            check_token();
            skip_whitespace();
            assert(lit.size() >= 3);
            assert(lit[0] == '/');
            const auto lit_end = lit.find_last_of('/');
            assert(lit_end > 1 && lit_end != std::wstring_view::npos);
            return make_expression<regexp_literal_expression>(lit.substr(1, lit_end-1), lit.substr(lit_end+1));
        } else if (accept(token_type::lparen)) {
            auto e = parse_expression();
            EXPECT(token_type::rparen);
            return e;
        } else if (is_literal(current_token_type())) {
            check_literal();
            return make_expression<literal_expression>(get_token());
        }
        UNHANDLED();
    }